

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like.cpp
# Opt level: O2

ScalarFunction * duckdb::NotILikeFun::GetFunction(void)

{
  LogicalType varargs;
  ScalarFunction *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff24;
  FunctionNullHandling in_stack_ffffffffffffff30;
  allocator_type local_ca;
  allocator local_c9;
  code *bind_lambda;
  LogicalType local_a8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_90;
  LogicalType local_78;
  LogicalType local_60 [2];
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,"!~~*",&local_c9);
  LogicalType::LogicalType(local_60,VARCHAR);
  LogicalType::LogicalType(local_60 + 1,VARCHAR);
  __l._M_len = 2;
  __l._M_array = local_60;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_90,__l,&local_ca);
  LogicalType::LogicalType(&local_a8,BOOLEAN);
  bind_lambda = ScalarFunction::
                BinaryFunction<duckdb::string_t,duckdb::string_t,bool,duckdb::NotILikeOperator>;
  LogicalType::LogicalType(&local_78,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_78;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_ffffffffffffff1c;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_ffffffffffffff24;
  ScalarFunction::ScalarFunction
            (in_RDI,&local_30,(vector<duckdb::LogicalType,_true> *)&local_90,&local_a8,
             (scalar_function_t *)&stack0xffffffffffffff38,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,ILikePropagateStats<duckdb::NotILikeOperatorASCII>
             ,(init_local_state_t)0x0,varargs,CONSISTENT,in_stack_ffffffffffffff30,bind_lambda);
  LogicalType::~LogicalType(&local_78);
  ::std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffff38);
  LogicalType::~LogicalType(&local_a8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_90);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_60[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  ::std::__cxx11::string::~string((string *)&local_30);
  (in_RDI->super_BaseScalarFunction).collation_handling = PUSH_COMBINABLE_COLLATIONS;
  return in_RDI;
}

Assistant:

ScalarFunction NotILikeFun::GetFunction() {
	ScalarFunction not_ilike("!~~*", {LogicalType::VARCHAR, LogicalType::VARCHAR}, LogicalType::BOOLEAN,
	                         ScalarFunction::BinaryFunction<string_t, string_t, bool, NotILikeOperator>, nullptr,
	                         nullptr, ILikePropagateStats<NotILikeOperatorASCII>);
	not_ilike.collation_handling = FunctionCollationHandling::PUSH_COMBINABLE_COLLATIONS;
	return not_ilike;
}